

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackSTGZGenerator.cxx
# Opt level: O2

int __thiscall cmCPackSTGZGenerator::PackageFiles(cmCPackSTGZGenerator *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  pointer pbVar5;
  
  iVar2 = cmCPackArchiveGenerator::PackageFiles((cmCPackArchiveGenerator *)this);
  if (iVar2 == 0) {
    uVar3 = 0;
  }
  else {
    bVar4 = 1;
    for (pbVar5 = (this->super_cmCPackTGZGenerator).super_cmCPackArchiveGenerator.
                  super_cmCPackGenerator.packageFileNames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar5 != *(pointer *)
                   ((long)&(this->super_cmCPackTGZGenerator).super_cmCPackArchiveGenerator.
                           super_cmCPackGenerator.packageFileNames.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data + 8); pbVar5 = pbVar5 + 1) {
      bVar1 = cmsys::SystemTools::SetPermissions((pbVar5->_M_dataplus)._M_p,0x1ff,false);
      bVar4 = bVar4 & bVar1;
    }
    uVar3 = (uint)bVar4;
  }
  return uVar3;
}

Assistant:

int cmCPackSTGZGenerator::PackageFiles()
{
  bool retval = true;
  if (!this->Superclass::PackageFiles()) {
    return 0;
  }

  /* TGZ generator (our Superclass) may
   * have generated several packages (component packaging)
   * so we must iterate over generated packages.
   */
  for (std::vector<std::string>::iterator it = packageFileNames.begin();
       it != packageFileNames.end(); ++it) {
    retval &= cmSystemTools::SetPermissions((*it).c_str(),
#if defined(_MSC_VER) || defined(__MINGW32__)
                                            S_IREAD | S_IWRITE | S_IEXEC
#else
                                            S_IRUSR | S_IWUSR | S_IXUSR |
                                              S_IRGRP | S_IWGRP | S_IXGRP |
                                              S_IROTH | S_IWOTH | S_IXOTH
#endif
                                            );
  }
  return retval;
}